

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::World::getTrainsOfPlayer(World *this,Player *player)

{
  const_iterator cVar1;
  Player *local_8;
  
  local_8 = player;
  cVar1 = std::
          _Rb_tree<const_tiger::trains::world::Player_*,_std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>,_std::_Select1st<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
          ::find(&(this->trainsOfPlayer)._M_t,&local_8);
  return (vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *)
         &cVar1._M_node[1]._M_parent;
}

Assistant:

const std::vector<Train *> &World::getTrainsOfPlayer(const Player *player) const
{
    return trainsOfPlayer.find(player)->second;
}